

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CEAngle CECoordinates::AngularSeparation
                  (CEAngle *xcoord_first,CEAngle *ycoord_first,CEAngle *xcoord_second,
                  CEAngle *ycoord_second)

{
  CEAngle *in_RCX;
  CEAngle *in_RDX;
  CEAngle *in_RSI;
  _func_int **in_RDI;
  CEAngle *in_R8;
  double dVar1;
  double *angle;
  CEAngle *this;
  double dVar2;
  double extraout_XMM0_Qa;
  CEAngle CVar3;
  CEAngle *angsep;
  
  dVar1 = CEAngle::operator_cast_to_double(in_RSI);
  angle = (double *)CEAngle::operator_cast_to_double(in_RDX);
  this = (CEAngle *)CEAngle::operator_cast_to_double(in_RCX);
  dVar2 = CEAngle::operator_cast_to_double(in_R8);
  iauSeps(dVar1,angle,this,SUB84(dVar2,0));
  CEAngle::CEAngle(this,angle);
  CVar3.angle_ = extraout_XMM0_Qa;
  CVar3._vptr_CEAngle = in_RDI;
  return CVar3;
}

Assistant:

CEAngle CECoordinates::AngularSeparation(const CEAngle& xcoord_first, 
                                         const CEAngle& ycoord_first,
                                         const CEAngle& xcoord_second, 
                                         const CEAngle& ycoord_second)
{
    // Call the 'iauSeps' SOFA algorithm
    CEAngle angsep(iauSeps(xcoord_first, ycoord_first,
                           xcoord_second, ycoord_second)) ;
    
    return angsep ;
}